

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

bool __thiscall Table::in_escape_chars(Table *this,char *ch)

{
  _Base_ptr p_Var1;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  _Rb_tree_header *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  p_Var1 = (this->escape_chars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_30,&local_50,*ch);
  p_Var3 = &(this->escape_chars)._M_t._M_impl.super__Rb_tree_header;
  _Var2 = std::
          __find_if<std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (p_Var1,p_Var3,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return (_Rb_tree_header *)_Var2._M_node != p_Var3;
}

Assistant:

bool Table::in_escape_chars(const char &ch) {
    return std::find(escape_chars.begin(), escape_chars.end(), std::string() + ch) != escape_chars.end();
}